

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O2

void test_construct(void)

{
  _Bool _Var1;
  bitset_t *bitset;
  short sVar2;
  size_t sVar3;
  short sVar4;
  undefined8 uStack_30;
  
  bitset = bitset_create();
  for (sVar3 = 0; sVar3 != 3000; sVar3 = sVar3 + 3) {
    bitset_set(bitset,sVar3);
  }
  sVar3 = bitset_count(bitset);
  if (sVar3 == 1000) {
    sVar4 = 0;
    sVar3 = 0;
    do {
      if (sVar3 == 3000) {
        bitset_free(bitset);
        return;
      }
      sVar2 = ((ushort)sVar3 / 3) * 3 + sVar4;
      _Var1 = bitset_get(bitset,sVar3);
      sVar3 = sVar3 + 1;
      sVar4 = sVar4 + -1;
    } while ((sVar2 != 0) != _Var1);
    uStack_30 = 0x36;
  }
  else {
    uStack_30 = 0x34;
  }
  fprintf(_stderr,"Assertion failed in %s at line %d\n","test_construct",uStack_30);
  exit(1);
}

Assistant:

void test_construct() {
  bitset_t *b = bitset_create();
  for (int k = 0; k < 1000; ++k)
    bitset_set(b, 3 * k);
  TEST_ASSERT(bitset_count(b) == 1000);
  for (int k = 0; k < 3 * 1000; ++k)
    TEST_ASSERT(bitset_get(b, k) == (k / 3 * 3 == k));
  bitset_free(b);
}